

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O1

void ihevc_sao_band_offset_luma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,WORD32 sao_band_pos,WORD8 *pi1_sao_offset,WORD32 wd,
               WORD32 ht)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  UWORD8 *pUVar4;
  int local_a8 [10];
  WORD32 band_table [32];
  
  if (0 < ht) {
    pUVar4 = pu1_src + (long)wd + -1;
    uVar3 = 0;
    do {
      pu1_src_left[uVar3] = *pUVar4;
      uVar3 = uVar3 + 1;
      pUVar4 = pUVar4 + src_strd;
    } while ((uint)ht != uVar3);
  }
  *pu1_src_top_left = pu1_src_top[(long)wd + -1];
  if (0 < wd) {
    uVar3 = 0;
    do {
      pu1_src_top[uVar3] = pu1_src[uVar3 + (long)((ht + -1) * src_strd)];
      uVar3 = uVar3 + 1;
    } while ((uint)wd != uVar3);
  }
  band_table[0x12] = 0;
  band_table[0x13] = 0;
  band_table[0x14] = 0;
  band_table[0x15] = 0;
  band_table[0xe] = 0;
  band_table[0xf] = 0;
  band_table[0x10] = 0;
  band_table[0x11] = 0;
  band_table[10] = 0;
  band_table[0xb] = 0;
  band_table[0xc] = 0;
  band_table[0xd] = 0;
  band_table[6] = 0;
  band_table[7] = 0;
  band_table[8] = 0;
  band_table[9] = 0;
  band_table[2] = 0;
  band_table[3] = 0;
  band_table[4] = 0;
  band_table[5] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  band_table[0] = 0;
  band_table[1] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  iVar1 = 1;
  do {
    local_a8[sao_band_pos & 0x1f] = iVar1;
    sao_band_pos = sao_band_pos + 1;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 5);
  if (0 < ht) {
    iVar1 = 0;
    do {
      if (0 < wd) {
        uVar3 = 0;
        do {
          iVar2 = (int)pi1_sao_offset[local_a8[pu1_src[uVar3] >> 3]] + (uint)pu1_src[uVar3];
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          pu1_src[uVar3] = (UWORD8)iVar2;
          uVar3 = uVar3 + 1;
        } while ((uint)wd != uVar3);
      }
      pu1_src = pu1_src + src_strd;
      iVar1 = iVar1 + 1;
    } while (iVar1 != ht);
  }
  return;
}

Assistant:

void ihevc_sao_band_offset_luma(UWORD8 *pu1_src,
                                WORD32 src_strd,
                                UWORD8 *pu1_src_left,
                                UWORD8 *pu1_src_top,
                                UWORD8 *pu1_src_top_left,
                                WORD32 sao_band_pos,
                                WORD8 *pi1_sao_offset,
                                WORD32 wd,
                                WORD32 ht)
{
    WORD32 band_shift;
    WORD32 band_table[NUM_BAND_TABLE];
    WORD32 i;
    WORD32 row, col;

    /* Updating left and top and top-left */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = pu1_src[row * src_strd + (wd - 1)];
    }
    pu1_src_top_left[0] = pu1_src_top[wd - 1];
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    band_shift = BIT_DEPTH_LUMA - 5;
    for(i = 0; i < NUM_BAND_TABLE; i++)
    {
        band_table[i] = 0;
    }
    for(i = 0; i < 4; i++)
    {
        band_table[(i + sao_band_pos) & 31] = i + 1;
    }

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            WORD32 band_idx;

            band_idx = band_table[pu1_src[col] >> band_shift];
            pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[band_idx], 0, (1 << (band_shift + 5)) - 1);
        }
        pu1_src += src_strd;
    }
}